

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O1

int factorial(int32_t a)

{
  int iVar1;
  undefined8 extraout_RAX;
  int i;
  int iVar2;
  string local_30;
  
  if (-1 < a) {
    iVar1 = 1;
    if (1 < a) {
      iVar2 = 1;
      do {
        iVar1 = iVar1 * iVar2;
        iVar2 = iVar2 + 1;
      } while (a != iVar2);
    }
    return iVar1;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"factorial is not defined for negative numbers","");
  error(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int factorial(int32_t a)
{
	if (a < 0)
		error("factorial is not defined for negative numbers");
	uint32_t factorial = 1;
	if (a != 0)
	{
		for (int i = 1; i < a; ++i)
			factorial *= i;
	}
	return factorial;
}